

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O2

btree_result btree_remove(btree *btree,void *key)

{
  uint16_t uVar1;
  bnode_flag_t flag;
  _func_voidref_void_ptr_bid_t *p_Var2;
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *p_Var3;
  _func_bid_t_void_ptr *p_Var4;
  code *pcVar5;
  _func_voidref_bid_t_ptr *p_Var6;
  _func_void_void_ptr_bid_t *p_Var7;
  _func_size_t_void_ptr_bid_t *p_Var8;
  _func_size_t_bnode_ptr_void_ptr_void_ptr_void_ptr_size_t *p_Var9;
  _func_voidref_void_ptr_bid_t_ptr *p_Var10;
  _func_void_bnode_ptr_bnode_ptr_idx_t_idx_t_idx_t *p_Var11;
  void *pvVar12;
  _func_int_void_ptr_bid_t *p_Var13;
  _func_voidref_void_ptr_bid_t_bid_t_ptr *p_Var14;
  _func_void_void_ptr *p_Var15;
  undefined1 *puVar16;
  undefined1 *puVar17;
  idx_t iVar18;
  ushort uVar19;
  metasize_t mVar20;
  int iVar21;
  voidref pvVar22;
  bnode *pbVar23;
  bid_t bVar24;
  size_t sVar25;
  size_t sVar26;
  btree_print_func *pbVar27;
  ulong uVar28;
  undefined1 *buf;
  ulong uVar29;
  long lVar30;
  long lVar31;
  bnode *pbVar32;
  uint uVar33;
  btree_result bVar34;
  long lVar35;
  void *pvVar36;
  undefined1 *puVar37;
  undefined1 *puVar38;
  ulong uVar39;
  bool bVar40;
  bid_t bStack_d0;
  undefined1 local_c8 [8];
  btree_meta meta;
  bid_t _bid;
  bid_t local_a8;
  bid_t new_root_bid;
  long local_98;
  bnode *local_90;
  long local_88;
  void *local_80;
  long local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  long local_60;
  undefined1 *local_58;
  bnode *local_50;
  undefined1 *local_48;
  long local_40;
  undefined1 *local_38;
  
  local_80 = key;
  uVar39 = (ulong)(btree->ksize + 0xf & 0xfffffff0);
  puVar37 = local_c8 + -uVar39;
  uVar29 = (ulong)(btree->vsize + 0xf & 0xfffffff0);
  local_38 = puVar37 + -uVar29;
  local_48 = local_38 + -uVar39;
  local_68 = local_48 + -uVar29;
  uVar19 = btree->height;
  uVar39 = (ulong)uVar19;
  local_88 = (long)(local_48 + -uVar29) - (ulong)((uint)uVar19 * 2 + 0xf & 0xfffffff0);
  uVar29 = (ulong)((uint)uVar19 * 8 + 0xf & 0xfffffff0);
  lVar35 = local_88 - uVar29;
  uVar28 = (ulong)(uVar19 + 0xf & 0xfffffff0);
  lVar30 = lVar35 - uVar28;
  local_40 = lVar30;
  lVar31 = lVar30 - uVar28;
  puVar38 = (undefined1 *)(lVar31 - uVar28);
  buf = puVar38 + -uVar29;
  local_58 = buf;
  for (uVar29 = 0; puVar16 = local_38, uVar39 != uVar29; uVar29 = uVar29 + 1) {
    puVar38[uVar29] = 0;
    *(undefined1 *)(lVar30 + uVar29) = 0;
    *(undefined1 *)(lVar31 + uVar29) = 0;
  }
  local_98 = lVar31;
  pbVar27 = btree->kv_ops->init_kv_var;
  if (pbVar27 != (btree_print_func *)0x0) {
    *(undefined8 *)(buf + -8) = 0x112016;
    (*pbVar27)(btree,puVar37,puVar16);
    puVar17 = local_48;
    puVar16 = local_68;
    pbVar27 = btree->kv_ops->init_kv_var;
    *(undefined8 *)(buf + -8) = 0x112028;
    (*pbVar27)(btree,puVar17,puVar16);
    uVar39 = (ulong)btree->height;
  }
  new_root_bid = (bid_t)puVar38;
  *puVar38 = 1;
  *(bid_t *)(lVar35 + -8 + uVar39 * 8) = btree->root_bid;
  local_60 = lVar35;
  while (uVar29 = uVar39 - 1, uVar39 != 0) {
    pvVar36 = btree->blk_handle;
    bVar24 = *(bid_t *)(lVar35 + uVar29 * 8);
    p_Var2 = btree->blk_ops->blk_read;
    *(undefined8 *)(buf + -8) = 0x112061;
    pvVar22 = (*p_Var2)(pvVar36,bVar24);
    *(undefined8 *)(buf + -8) = 0x112070;
    pbVar23 = _fetch_bnode(btree,pvVar22,(uint16_t)uVar39);
    pvVar36 = local_80;
    *(bnode **)(local_58 + uVar29 * 8) = pbVar23;
    *(undefined8 *)(buf + -8) = 0x11208a;
    iVar18 = _btree_find_entry(btree,pbVar23,pvVar36);
    puVar38 = local_38;
    *(idx_t *)(local_88 + uVar29 * 2) = iVar18;
    if (iVar18 == 0xffff) {
      p_Var15 = btree->blk_ops->blk_operation_end;
      if (p_Var15 != (_func_void_void_ptr *)0x0) {
        pvVar36 = btree->blk_handle;
        *(undefined8 *)(buf + -8) = 0x112527;
        (*p_Var15)(pvVar36);
      }
      pbVar27 = btree->kv_ops->free_kv_var;
      *(undefined8 *)(buf + -8) = 2;
      bVar34 = (btree_result)*(undefined8 *)(buf + -8);
      goto LAB_00112533;
    }
    p_Var3 = btree->kv_ops->get_kv;
    *(undefined8 *)(buf + -8) = 0x1120b1;
    (*p_Var3)(pbVar23,iVar18,puVar37,puVar38);
    puVar38 = local_38;
    lVar35 = local_60;
    bVar40 = uVar39 != 1;
    uVar39 = uVar29;
    if (bVar40) {
      p_Var4 = btree->kv_ops->value2bid;
      *(undefined8 *)(buf + -8) = 0x1120c9;
      bVar24 = (*p_Var4)(puVar38);
      *(bid_t *)(lVar35 + -8 + uVar29 * 8) =
           bVar24 >> 0x38 | (bVar24 & 0xff000000000000) >> 0x28 | (bVar24 & 0xff0000000000) >> 0x18
           | (bVar24 & 0xff00000000) >> 8 | (bVar24 & 0xff000000) << 8 | (bVar24 & 0xff0000) << 0x18
           | (bVar24 & 0xff00) << 0x28 | bVar24 << 0x38;
    }
  }
  *(undefined8 *)(buf + -8) = 1;
  uVar39 = *(ulong *)(buf + -8);
  pvVar36 = (void *)0x0;
  local_78 = 0;
  local_70 = puVar37;
  do {
    puVar16 = local_38;
    puVar38 = local_58;
    if ((ulong)btree->height <= uVar39 - 1) {
      p_Var15 = btree->blk_ops->blk_operation_end;
      if (p_Var15 != (_func_void_void_ptr *)0x0) {
        pvVar36 = btree->blk_handle;
        *(undefined8 *)(buf + -8) = 0x112507;
        (*p_Var15)(pvVar36);
      }
      pbVar27 = btree->kv_ops->free_kv_var;
      bVar34 = BTREE_RESULT_SUCCESS;
LAB_00112533:
      puVar38 = local_38;
      if (pbVar27 != (btree_print_func *)0x0) {
        *(undefined8 *)(buf + -8) = 0x112544;
        (*pbVar27)(btree,puVar37,puVar38);
        puVar38 = local_48;
        puVar37 = local_68;
        pbVar27 = btree->kv_ops->free_kv_var;
        *(undefined8 *)(buf + -8) = 0x112556;
        (*pbVar27)(btree,puVar38,puVar37);
      }
      return bVar34;
    }
    local_80 = pvVar36;
    if (uVar39 != 1) {
      pbVar23 = *(bnode **)(local_58 + uVar39 * 8 + -8);
      iVar18 = *(idx_t *)(local_88 + -2 + uVar39 * 2);
      p_Var3 = btree->kv_ops->get_kv;
      local_50 = pbVar23;
      *(undefined8 *)(buf + -8) = 0x112135;
      (*p_Var3)(pbVar23,iVar18,puVar37,puVar16);
      puVar17 = local_48;
      puVar16 = local_68;
      pbVar23 = *(bnode **)(puVar38 + uVar39 * 8 + -0x10);
      if (pbVar23->nentry != 0) {
        p_Var3 = btree->kv_ops->get_kv;
        *(undefined8 *)(buf + -8) = 0x112154;
        (*p_Var3)(pbVar23,0,puVar17,puVar16);
        pvVar36 = btree->aux;
        pcVar5 = (code *)btree->kv_ops->cmp;
        *(undefined8 *)(buf + -8) = 0x112165;
        iVar21 = (*pcVar5)(puVar17,puVar37,pvVar36);
        puVar16 = local_38;
        puVar38 = local_48;
        pbVar23 = local_50;
        if (iVar21 != 0) {
          p_Var3 = btree->kv_ops->set_kv;
          *(undefined8 *)(buf + -8) = 0x112182;
          (*p_Var3)(pbVar23,iVar18,puVar38,puVar16);
          pbVar27 = btree->kv_ops->set_key;
          *(undefined8 *)(buf + -8) = 0x112192;
          (*pbVar27)(btree,puVar37,puVar38);
          *(undefined1 *)(local_40 + -1 + uVar39) = 1;
        }
      }
      if (*(char *)(local_98 + -2 + uVar39) != '\0') {
        uVar29 = *(ulong *)(local_60 + -0x10 + uVar39 * 8);
        meta.data = (void *)(uVar29 >> 0x38 | (uVar29 & 0xff000000000000) >> 0x28 |
                             (uVar29 & 0xff0000000000) >> 0x18 | (uVar29 & 0xff00000000) >> 8 |
                             (uVar29 & 0xff000000) << 8 | (uVar29 & 0xff0000) << 0x18 |
                             (uVar29 & 0xff00) << 0x28 | uVar29 << 0x38);
        p_Var3 = btree->kv_ops->set_kv;
        p_Var6 = btree->kv_ops->bid2value;
        *(undefined8 *)(buf + -8) = 0x1121d3;
        pvVar22 = (*p_Var6)((bid_t *)&meta.data);
        pbVar23 = local_50;
        puVar37 = local_70;
        *(undefined8 *)(buf + -8) = 0x1121e4;
        (*p_Var3)(pbVar23,iVar18,puVar37,pvVar22);
        *(undefined1 *)(local_40 + -1 + uVar39) = 1;
        puVar37 = local_70;
      }
    }
    puVar38 = local_38;
    lVar35 = local_60;
    if (*(char *)((new_root_bid - 1) + uVar39) != '\0') {
      pbVar23 = *(bnode **)(local_58 + uVar39 * 8 + -8);
      iVar18 = *(idx_t *)(local_88 + -2 + uVar39 * 2);
      p_Var3 = btree->kv_ops->get_kv;
      *(undefined8 *)(buf + -8) = 0x11222c;
      (*p_Var3)(pbVar23,iVar18,puVar37,puVar38);
      if (pbVar23->nentry == 0) {
        pbVar32 = (bnode *)(local_40 + local_78);
        *(undefined1 *)(local_40 + -1 + uVar39) = 1;
LAB_001122a0:
        uVar19 = btree->height;
        uVar29 = (ulong)uVar19;
        if (uVar29 <= uVar39) {
          uVar28 = local_78 + 1;
          goto LAB_001122bf;
        }
      }
      else {
        *(undefined8 *)(buf + -8) = 0x112242;
        iVar18 = _btree_find_entry(btree,pbVar23,puVar37);
        if (iVar18 == 0xffff) {
          iVar18 = pbVar23->nentry;
        }
        else {
          p_Var3 = btree->kv_ops->ins_kv;
          *(undefined8 *)(buf + -8) = 0x11225a;
          (*p_Var3)(pbVar23,iVar18,(void *)0x0,(void *)0x0);
          iVar18 = pbVar23->nentry - 1;
          pbVar23->nentry = iVar18;
        }
        pbVar32 = (bnode *)(local_40 + uVar39 + -1);
        *(undefined1 *)&pbVar32->kvsize = 1;
        if (iVar18 != 1) {
          if (iVar18 != 0) goto LAB_00112470;
          goto LAB_001122a0;
        }
        uVar19 = btree->height;
        uVar29 = (ulong)uVar19;
        uVar28 = uVar39;
LAB_001122bf:
        if (uVar28 != uVar29) goto LAB_00112470;
      }
      if (1 < uVar19) {
        pvVar36 = btree->blk_handle;
        bVar24 = *(bid_t *)(lVar35 + -8 + uVar39 * 8);
        p_Var7 = btree->blk_ops->blk_remove;
        local_50 = pbVar32;
        *(undefined8 *)(buf + -8) = 0x1122e6;
        (*p_Var7)(pvVar36,bVar24);
        puVar38 = local_38;
        if (uVar39 < btree->height) {
          *(undefined1 *)(new_root_bid + uVar39) = 1;
        }
        else {
          buf = buf + -((ulong)btree->blksize + 0xf & 0xfffffffffffffff0);
          p_Var3 = btree->kv_ops->get_kv;
          *(undefined8 *)(buf + -8) = 0x112329;
          (*p_Var3)(pbVar23,0,puVar37,puVar38);
          p_Var4 = btree->kv_ops->value2bid;
          *(undefined8 *)(buf + -8) = 0x112333;
          bVar24 = (*p_Var4)(puVar38);
          uVar29 = bVar24 >> 0x38 | (bVar24 & 0xff000000000000) >> 0x28 |
                   (bVar24 & 0xff0000000000) >> 0x18 | (bVar24 & 0xff00000000) >> 8 |
                   (bVar24 & 0xff000000) << 8 | (bVar24 & 0xff0000) << 0x18 |
                   (bVar24 & 0xff00) << 0x28 | bVar24 << 0x38;
          pvVar36 = btree->blk_handle;
          p_Var2 = btree->blk_ops->blk_read;
          *(undefined8 *)(buf + -8) = 0x112347;
          pvVar22 = (*p_Var2)(pvVar36,uVar29);
          uVar1 = btree->height;
          *(undefined8 *)(buf + -8) = 0x112356;
          local_90 = _fetch_bnode(btree,pvVar22,uVar1);
          pvVar36 = btree->blk_handle;
          p_Var8 = btree->blk_ops->blk_get_size;
          *(undefined8 *)(buf + -8) = 0x112372;
          sVar25 = (*p_Var8)(pvVar36,uVar29);
          *(undefined8 *)(buf + -8) = 0x112383;
          mVar20 = btree_read_meta(btree,buf);
          pbVar23 = local_90;
          uVar33 = mVar20 + 0x11 & 0xfffffff0;
          p_Var9 = btree->kv_ops->get_data_size;
          local_c8._0_2_ = mVar20;
          meta._0_8_ = buf;
          *(undefined8 *)(buf + -8) = 0x1123b4;
          sVar26 = (*p_Var9)(pbVar23,(void *)0x0,(void *)0x0,(void *)0x0,0);
          if (mVar20 == 0) {
            uVar33 = 0;
          }
          lVar35 = local_60;
          puVar37 = local_70;
          if ((int)sVar26 + uVar33 + 0x10 < (int)sVar25 - 1U) {
            btree->height = btree->height - 1;
            pvVar36 = btree->blk_handle;
            p_Var10 = btree->blk_ops->blk_alloc;
            *(undefined8 *)(buf + -8) = 0x1123e5;
            pvVar22 = (*p_Var10)(pvVar36,&local_a8);
            bVar24 = local_a8;
            flag = btree->root_flag;
            uVar1 = btree->height;
            *(undefined8 *)(buf + -8) = 0x11240a;
            _btree_init_node(btree,bVar24,pvVar22,flag,uVar1,(btree_meta *)local_c8);
            uVar1 = btree->height;
            *(undefined8 *)(buf + -8) = 0x112419;
            pbVar32 = _fetch_bnode(btree,pvVar22,uVar1);
            pbVar23 = local_90;
            iVar18 = local_90->nentry;
            p_Var11 = btree->kv_ops->copy_kv;
            *(undefined8 *)(buf + -8) = 0x112439;
            (*p_Var11)(pbVar32,pbVar23,0,0,iVar18);
            pbVar32->nentry = pbVar23->nentry;
            pvVar36 = btree->blk_handle;
            p_Var7 = btree->blk_ops->blk_remove;
            *(undefined8 *)(buf + -8) = 0x112456;
            (*p_Var7)(pvVar36,uVar29);
            btree->root_bid = local_a8;
            *(undefined1 *)&local_50->kvsize = 0;
            lVar35 = local_60;
            puVar37 = local_70;
          }
        }
      }
    }
LAB_00112470:
    pvVar36 = local_80;
    if (*(char *)(local_40 + -1 + uVar39) != '\0') {
      pvVar12 = btree->blk_handle;
      bVar24 = *(bid_t *)(lVar35 + -8 + uVar39 * 8);
      p_Var13 = btree->blk_ops->blk_is_writable;
      *(undefined8 *)(buf + -8) = 0x112490;
      iVar21 = (*p_Var13)(pvVar12,bVar24);
      pvVar12 = btree->blk_handle;
      bVar24 = *(bid_t *)(lVar35 + -8 + uVar39 * 8);
      if (iVar21 == 0) {
        p_Var14 = btree->blk_ops->blk_move;
        *(undefined8 *)(buf + -8) = 0x1124ad;
        pvVar22 = (*p_Var14)(pvVar12,bVar24,(bid_t *)(lVar35 + (long)pvVar36));
        *(undefined8 *)(buf + -8) = 0x1124bc;
        pbVar23 = _fetch_bnode(btree,pvVar22,(uint16_t)uVar39);
        *(bnode **)(local_58 + uVar39 * 8 + -8) = pbVar23;
        *(undefined1 *)(local_98 + -1 + uVar39) = 1;
        if (uVar39 == btree->height) {
          btree->root_bid = *(bid_t *)(lVar35 + -8 + uVar39 * 8);
        }
      }
      else {
        p_Var7 = btree->blk_ops->blk_set_dirty;
        *(undefined8 *)(buf + -8) = 0x1124a4;
        (*p_Var7)(pvVar12,bVar24);
      }
    }
    local_78 = local_78 + 1;
    uVar39 = uVar39 + 1;
    pvVar36 = (void *)((long)pvVar36 + 8);
  } while( true );
}

Assistant:

btree_result btree_remove(struct btree *btree, void *key)
{
    void *addr;
    uint8_t *k = alca(uint8_t, btree->ksize);
    uint8_t *v= alca(uint8_t, btree->vsize);
    uint8_t *kk = alca(uint8_t, btree->ksize);
    uint8_t *vv = alca(uint8_t, btree->vsize);
    // index# and block ID for each level
    idx_t *idx = alca(idx_t, btree->height);
    bid_t *bid= alca(bid_t, btree->height);
    bid_t _bid;
    // flags
    int8_t *modified = alca(int8_t, btree->height);
    int8_t *moved = alca(int8_t, btree->height);
    int8_t *rmv = alca(int8_t, btree->height);
    // index# of removed key
    idx_t *idx_rmv = alca(idx_t, btree->height);
    struct bnode **node = alca(struct bnode *, btree->height);
    int i;

    // initialize flags
    for (i=0;i<btree->height;++i) {
        moved[i] = modified[i] = rmv[i] = 0;
    }
    if (btree->kv_ops->init_kv_var) {
        btree->kv_ops->init_kv_var(btree, k, v);
        btree->kv_ops->init_kv_var(btree, kk, vv);
    }

    rmv[0] = 1;

    // set root
    bid[btree->height-1] = btree->root_bid;

    // find path from root to leaf
    for (i=btree->height-1; i>=0; --i) {
        // read block using bid
        addr = btree->blk_ops->blk_read(btree->blk_handle, bid[i]);
        // fetch node structure from block
        node[i] = _fetch_bnode(btree, addr, i+1);

        // lookup key in current node
        idx[i] = _btree_find_entry(btree, node[i], key);

        if (idx[i] == BTREE_IDX_NOT_FOUND) {
            // not found
            if (btree->blk_ops->blk_operation_end)
                btree->blk_ops->blk_operation_end(btree->blk_handle);
            if (btree->kv_ops->free_kv_var) {
                btree->kv_ops->free_kv_var(btree, k, v);
                btree->kv_ops->free_kv_var(btree, kk, vv);
            }
            return BTREE_RESULT_FAIL;
        }

        btree->kv_ops->get_kv(node[i], idx[i], k, v);

        if (i>0) {
            // index (non-leaf) node
            // get bid of child node from value
            bid[i-1] = btree->kv_ops->value2bid(v);
            bid[i-1] = _endian_decode(bid[i-1]);
        }else{
            // leaf node
        }
    }

    // cascaded remove from leaf to root
    for (i=0;i<btree->height;++i){
        // in case of index node
        if (i > 0) {
            btree->kv_ops->get_kv(node[i], idx[i], k, v);

            // when child node's smallest key is changed due to remove
              if (node[i-1]->nentry > 0) {
                btree->kv_ops->get_kv(node[i-1], 0, kk, vv);
                if (btree->kv_ops->cmp(kk, k, btree->aux)) {
                    // change current node's corresponding key
                    btree->kv_ops->set_kv(node[i], idx[i], kk, v);
                    //memcpy(k, kk, btree->ksize);
                    btree->kv_ops->set_key(btree, k, kk);
                    modified[i] = 1;
                }
            }

            // when child node is moved to new block
            if (moved[i-1]) {
                // replace the bid (value)
                _bid = _endian_encode(bid[i-1]);
                btree->kv_ops->set_kv(node[i], idx[i], k,
                                      btree->kv_ops->bid2value(&_bid));
                modified[i] = 1;
            }
        }

        if (rmv[i]) {
            // there is a key-value pair to be removed
            btree->kv_ops->get_kv(node[i], idx[i], k, v);
            idx_rmv[i] = _btree_remove_entry(btree, node[i], k);
            modified[i] = 1;

            /*
            remove the node when
            1. non-root node has no kv-pair or
            2. root node has less or equal than one kv-pair
            */
            if (((node[i]->nentry < 1 && i+1 < btree->height) ||
                (node[i]->nentry <= 1 && i+1 == btree->height)) &&
                btree->height > 1) {
                // remove the node
                btree->blk_ops->blk_remove(btree->blk_handle, bid[i]);
                if (i+1 < btree->height) {
                    // if non-root node
                    rmv[i+1] = 1;
                } else {
                    // if root node, shrink the height

                    // allocate new block for new root node
                    uint8_t *buf = alca(uint8_t, btree->blksize);
                    uint32_t nodesize = 0, new_rootsize = 0;
                    bid_t child_bid, new_root_bid;
                    struct bnode *new_root, *child;
                    struct btree_meta meta;

                    // read the child node
                    btree->kv_ops->get_kv(node[i], 0, k, v);
                    child_bid = btree->kv_ops->value2bid(v);
                    child_bid = _endian_decode(child_bid);
                    addr = btree->blk_ops->blk_read(btree->blk_handle, child_bid);
                    child = _fetch_bnode(btree, addr, btree->height);

                    nodesize = btree->blk_ops->blk_get_size(btree->blk_handle, child_bid);
#ifdef __CRC32
                    nodesize -= BLK_MARKER_SIZE;
#endif

                    // estimate the new root node size including metadata
                    meta.size = btree_read_meta(btree, buf);
                    meta.data = buf;

                    if (meta.size) {
                        new_rootsize += _metasize_align(meta.size) + sizeof(metasize_t);
                    }
                    new_rootsize += btree->kv_ops->get_data_size(child, NULL, NULL, NULL, 0);
                    new_rootsize += sizeof(struct bnode);

                    if (new_rootsize < nodesize) {
                        // new root node has enough space for metadata .. shrink height
                        btree->height--;

                        // allocate a new node with the given meta
                        addr = btree->blk_ops->blk_alloc(btree->blk_handle,
                                                         &new_root_bid);
                        _btree_init_node(btree, new_root_bid, addr,
                                         btree->root_flag, btree->height, &meta);
                        new_root = _fetch_bnode(btree, addr, btree->height);

                        // copy all entries
                        btree->kv_ops->copy_kv(new_root, child, 0, 0, child->nentry);
                        new_root->nentry = child->nentry;
                        // invalidate chlid node
                        btree->blk_ops->blk_remove(btree->blk_handle, child_bid);

                        btree->root_bid = new_root_bid;

                        // as the old node is invalidated,
                        // we don't need to move it.
                        modified[i] = 0;
                    }
                }
            }
        }

        if (modified[i]) {
            // when node is modified
            if (!btree->blk_ops->blk_is_writable(btree->blk_handle, bid[i])) {
                // already flushed block -> cannot overwrite, so
                // we have to move to new block
                // get new bid[i]
                addr = btree->blk_ops->blk_move(btree->blk_handle, bid[i],
                                                &bid[i]);
                node[i] = _fetch_bnode(btree, addr, i+1);
                moved[i] = 1;

                if (i+1 == btree->height)
                    // if moved node is root node
                    btree->root_bid = bid[i];

            }else{
                btree->blk_ops->blk_set_dirty(btree->blk_handle, bid[i]);
            }

        }
    }

    if (btree->blk_ops->blk_operation_end) {
        btree->blk_ops->blk_operation_end(btree->blk_handle);
    }
    if (btree->kv_ops->free_kv_var) {
        btree->kv_ops->free_kv_var(btree, k, v);
        btree->kv_ops->free_kv_var(btree, kk, vv);
    }
    return BTREE_RESULT_SUCCESS;
}